

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int bufcopy(uchar *a,int n,uchar *buffer,int *b,int bmax)

{
  int i;
  int bmax_local;
  int *b_local;
  uchar *buffer_local;
  int n_local;
  uchar *a_local;
  
  i = 0;
  do {
    if (n <= i) {
      return 0;
    }
    if (a[i] != '\0') {
      bitbuffer = code[a[i]] << ((byte)bits_to_go3 & 0x1f) | bitbuffer;
      bits_to_go3 = ncode[a[i]] + bits_to_go3;
      if (7 < bits_to_go3) {
        buffer[*b] = (uchar)bitbuffer;
        *b = *b + 1;
        if (bmax <= *b) {
          return 1;
        }
        bitbuffer = bitbuffer >> 8;
        bits_to_go3 = bits_to_go3 + -8;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static int
bufcopy(unsigned char a[], int n, unsigned char buffer[], int *b, int bmax)
{
int i;

	for (i = 0; i < n; i++) {
		if (a[i] != 0) {
			/*
			 * add Huffman code for a[i] to buffer
			 */
			bitbuffer |= code[a[i]] << bits_to_go3;
			bits_to_go3 += ncode[a[i]];
			if (bits_to_go3 >= 8) {
				buffer[*b] = bitbuffer & 0xFF;
				*b += 1;
				/*
				 * return warning code if we fill buffer
				 */
				if (*b >= bmax) return(1);
				bitbuffer >>= 8;
				bits_to_go3 -= 8;
			}
		}
	}
	return(0);
}